

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppnet_client.cpp
# Opt level: O1

void ConnectFunc(Handle *handle,uint32_t err)

{
  element_type *peVar1;
  ostream *poVar2;
  uint16_t port;
  string ip;
  string msg;
  undefined1 local_62 [2];
  char *local_60;
  long local_58;
  char local_50 [16];
  undefined1 *local_40;
  uint local_38;
  undefined1 local_30 [16];
  
  if (err != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," [ConnectFunc] some thing error : ",0x22);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    return;
  }
  local_58 = 0;
  local_50[0] = '\0';
  peVar1 = (handle->super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_60 = local_50;
  (*peVar1->_vptr_CNSocket[4])(peVar1,&local_60,local_62);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," [ConnectFunc] : ip : ",0x16);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_60,local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"port : ",7);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  GetMsg_abi_cxx11_();
  peVar1 = (handle->super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar1->_vptr_CNSocket[5])(peVar1,local_40,(ulong)local_38);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  return;
}

Assistant:

void ConnectFunc(Handle handle, uint32_t err) {
    if (err == CEC_SUCCESS) {
        std::string ip;
        uint16_t port;
        handle->GetAddress(ip, port);
        std::cout << " [ConnectFunc] : ip : " << ip << "port : " << port << std::endl;
        auto msg = GetMsg();
        handle->Write(msg.c_str(), (uint32_t)msg.length());

    } else {
        std::cout << " [ConnectFunc] some thing error : " << err << std::endl;
    }
}